

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9InputFormat(_func_int_jx9_context_ptr_char_ptr_int_void_ptr *xConsumer,jx9_context *pCtx,
                    char *zIn,int nByte,int nArg,jx9_value **apArg,void *pUserData,int vf)

{
  jx9_value *pjVar1;
  uint uVar2;
  uint3 uVar3;
  bool bVar4;
  unkbyte10 Var5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  sxi32 sVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  byte *pbVar18;
  char cVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  char *pcVar24;
  byte *pbVar25;
  byte *pbVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  ushort in_FPUControlWord;
  longdouble lVar30;
  longdouble lVar31;
  undefined1 auVar32 [16];
  char spaces [51];
  char zWorker [1024];
  uint local_524;
  uint local_51c;
  undefined8 local_518;
  int local_50c;
  jx9_value *local_508;
  undefined1 local_500 [16];
  int local_4f0;
  int local_4e4;
  ushort local_4e0;
  ushort local_4de;
  ushort local_4dc;
  ushort local_4da;
  _func_int_jx9_context_ptr_char_ptr_int_void_ptr *local_4d8;
  jx9_context *local_4d0;
  char *local_4c8;
  jx9_value **local_4c0;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  char local_478 [8];
  undefined7 uStack_470;
  undefined1 uStack_469;
  undefined2 uStack_468;
  undefined1 uStack_466;
  char *local_458;
  ulong local_450;
  double local_448;
  undefined8 local_440;
  char local_438 [1022];
  char local_3a [10];
  
  builtin_strncpy(local_478,"        ",8);
  uStack_470 = 0x20202020202020;
  local_488._8_8_ = 0x2020202020202020;
  local_488._0_8_ = 0x2020202020202020;
  local_498 = _DAT_00146c90;
  pbVar25 = (byte *)(zIn + nByte);
  local_524 = (uint)(vf != 1);
  local_450 = (ulong)-(uint)(vf != 0);
  uStack_469 = 0x20;
  uStack_468 = 0x2020;
  uStack_466 = 0;
  pcVar13 = (char *)(ulong)((int)local_438 - 1);
  local_4e4 = nArg;
  local_4d8 = xConsumer;
  local_4d0 = pCtx;
  local_4c0 = apArg;
  local_458 = pcVar13;
LAB_0013522b:
  for (pbVar26 = (byte *)zIn; pbVar26 < pbVar25; pbVar26 = pbVar26 + 1) {
    if (*pbVar26 == 0x25) {
      bVar4 = true;
      if (zIn < pbVar26) goto LAB_00135253;
      goto LAB_0013527e;
    }
  }
  if (pbVar26 <= zIn) {
    return (sxi32)pcVar13;
  }
  bVar4 = false;
LAB_00135253:
  iVar7 = (*local_4d8)(local_4d0,zIn,(int)pbVar26 - (int)zIn,pUserData);
  if (!bVar4) {
    return iVar7;
  }
  if (iVar7 == -10) {
    return -10;
  }
LAB_0013527e:
  Var5 = local_500._0_10_;
  pbVar26 = pbVar26 + 1;
  bVar4 = false;
  iVar7 = 0;
  iVar21 = 0;
  local_50c = 0;
  uVar20 = 0;
  do {
    bVar6 = *pbVar26;
    pbVar18 = pbVar26;
    if (bVar6 < 0x27) {
      if (bVar6 != 0) {
        if (bVar6 == 0x20) {
          iVar7 = 1;
        }
        else {
          if (bVar6 != 0x23) goto switchD_001352b6_caseD_28;
          uVar20 = 1;
        }
      }
    }
    else {
      switch(bVar6) {
      case 0x27:
        pbVar26 = pbVar26 + 1;
        if (pbVar25 <= pbVar26) goto switchD_001352b6_caseD_28;
        bVar6 = *pbVar26;
        uStack_468 = CONCAT11(bVar6,bVar6);
        auVar32 = pshuflw(ZEXT216(CONCAT11(bVar6,bVar6)),ZEXT216(CONCAT11(bVar6,bVar6)),0);
        local_478._0_4_ = auVar32._0_4_;
        local_478._4_4_ = local_478._0_4_;
        local_498._8_4_ = local_478._0_4_;
        local_498[0] = (char)local_478._0_4_;
        local_498[1] = (char)((uint)local_478._0_4_ >> 8);
        local_498[2] = (char)((uint)local_478._0_4_ >> 0x10);
        local_498[3] = (char)((uint)local_478._0_4_ >> 0x18);
        local_498[4] = (char)local_478._0_4_;
        local_498[5] = (char)((uint)local_478._0_4_ >> 8);
        local_498[6] = (char)((uint)local_478._0_4_ >> 0x10);
        local_498[7] = (char)((uint)local_478._0_4_ >> 0x18);
        local_498._12_4_ = local_478._0_4_;
        uStack_470 = local_498._8_7_;
        uStack_469 = auVar32[3];
        pbVar18 = pbVar26;
        local_488 = local_498;
        break;
      default:
switchD_001352b6_caseD_28:
        goto LAB_00135360;
      case 0x2b:
        iVar21 = 1;
        break;
      case 0x2d:
        bVar4 = true;
        break;
      case 0x30:
        local_50c = 1;
      }
    }
    pbVar26 = pbVar18 + 1;
  } while (pbVar18 < pbVar25);
LAB_00135360:
  if (pbVar26 < pbVar25) {
    uVar8 = 0;
    pbVar18 = pbVar26;
    do {
      pbVar26 = pbVar18 + 1;
      bVar6 = *pbVar18 - 0x30;
      if (9 < bVar6) {
        if (*pbVar18 == 0x24) {
          if (0 < (int)uVar8) {
            local_524 = (int)local_450 + uVar8;
          }
          if ((pbVar26 < pbVar25) && (*pbVar26 == 0x30)) {
            local_50c = 1;
            pbVar26 = pbVar18 + 2;
          }
          if (pbVar25 <= pbVar26) goto LAB_00135405;
          uVar8 = 0;
          goto LAB_001353e7;
        }
        break;
      }
      uVar8 = (uint)bVar6 + uVar8 * 10;
      pbVar18 = pbVar26;
    } while (pbVar26 < pbVar25);
  }
  else {
LAB_00135405:
    uVar8 = 0;
    pbVar18 = pbVar26;
  }
  goto LAB_00135408;
  while( true ) {
    uVar8 = (uint)(byte)(*pbVar26 - 0x30) + uVar8 * 10;
    pbVar26 = pbVar26 + 1;
    pbVar18 = pbVar26;
    if (pbVar25 <= pbVar26) break;
LAB_001353e7:
    pbVar18 = pbVar26;
    if (9 < (byte)(*pbVar26 - 0x30)) break;
  }
LAB_00135408:
  uVar12 = 0x3f6;
  uVar9 = 0x3f6;
  if ((int)uVar8 < 0x3f6) {
    uVar9 = uVar8;
  }
  uVar22 = 0xffffffff;
  if ((pbVar18 < pbVar25) && (*pbVar18 == 0x2e)) {
    pbVar18 = pbVar18 + 1;
    uVar22 = 0;
    if (pbVar18 < pbVar25) {
      uVar22 = 0;
      do {
        bVar6 = *pbVar18 - 0x30;
        uVar12 = CONCAT71((int7)(uVar12 >> 8),bVar6);
        if (9 < bVar6) break;
        uVar12 = (ulong)bVar6;
        uVar22 = (uint)bVar6 + uVar22 * 10;
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 < pbVar25);
    }
  }
  if (pbVar25 <= pbVar18) {
    return (sxi32)uVar12;
  }
  zIn = (char *)(pbVar18 + 1);
  lVar27 = 0;
LAB_0013546a:
  local_500._0_10_ = Var5;
  if (*pbVar18 != (&aFmt[0].fmttype)[lVar27]) goto code_r0x00135474;
  bVar6 = (&aFmt[0].type)[lVar27];
  local_500._1_7_ = 0;
  local_500[0] = bVar6;
  local_51c = 0;
  pcVar24 = (char *)(ulong)(bVar6 - 1);
  pcVar13 = pcVar24;
  if (7 < bVar6 - 1) goto switchD_00135572_caseD_4;
  pcVar13 = (char *)((long)&switchD_00135572::switchdataD_0014172c +
                    (long)(int)(&switchD_00135572::switchdataD_0014172c)[(long)pcVar24]);
  switch(pcVar24) {
  case (char *)0x0:
    if ((int)local_524 < local_4e4) {
      lVar14 = (long)(int)local_524;
      local_524 = local_524 + 1;
      pjVar1 = local_4c0[lVar14];
      if (pjVar1 == (jx9_value *)0x0) goto LAB_00135ebc;
      local_4c8 = (char *)CONCAT44(local_4c8._4_4_,iVar21);
      local_518 = uVar20;
      local_4f0 = iVar7;
      jx9MemObjToInteger(pjVar1);
      lVar14 = (pjVar1->x).iVal;
      if (0x3d7 < (int)uVar22) {
        uVar22 = 0x3d8;
      }
      local_518 = local_518 & 0xffffffff;
      if (lVar14 == 0) {
        local_518 = 0;
      }
      if ((*(byte *)((long)&aFmt[0].flags + lVar27) & 1) != 0) {
        if (-1 < lVar14) {
          iVar7 = local_4f0;
          iVar21 = (int)local_4c8;
          goto LAB_00135f6f;
        }
        lVar14 = -lVar14;
        local_508 = (jx9_value *)CONCAT71((uint7)(uint3)(local_524 >> 8),0x2d);
        goto LAB_00135f7f;
      }
      lVar17 = -lVar14;
      if (lVar14 < 1) {
        lVar14 = lVar17;
      }
      local_500._0_4_ = (int)CONCAT71((int7)((ulong)lVar17 >> 8),1);
LAB_00135ee7:
      iVar7 = 0;
      local_508 = (jx9_value *)0x0;
    }
    else {
LAB_00135ebc:
      if (0x3d7 < (int)uVar22) {
        uVar22 = 0x3d8;
      }
      local_518 = 0;
      if ((*(byte *)((long)&aFmt[0].flags + lVar27) & 1) == 0) {
        local_518 = 0;
        local_500._4_6_ = SUB106(Var5,4);
        local_500._0_4_ = 0x301;
        lVar14 = 0;
        goto LAB_00135ee7;
      }
      lVar14 = 0;
LAB_00135f6f:
      Var5 = local_500._0_10_;
      uVar3 = (uint3)(local_524 >> 8);
      if (iVar21 == 0) {
        local_500._1_3_ = uVar3;
        local_500[0] = iVar7 == 0;
        local_500._4_6_ = SUB106(Var5,4);
        bVar29 = iVar7 != 0;
        iVar7 = -(uint)bVar29;
        local_508 = (jx9_value *)(ulong)(byte)(bVar29 << 5);
      }
      else {
        local_508 = (jx9_value *)CONCAT71((uint7)uVar3,0x2b);
LAB_00135f7f:
        iVar7 = -1;
        local_500._0_10_ = (unkuint10)(uint6)local_500._4_6_ << 0x20;
      }
    }
    uVar8 = iVar7 + uVar9;
    if ((int)(iVar7 + uVar9) < (int)uVar22) {
      uVar8 = uVar22;
    }
    lVar17 = *(long *)((long)&aFmt[0].charset + lVar27);
    bVar6 = (&aFmt[0].base)[lVar27];
    iVar7 = -1;
    pcVar13 = local_3a;
    uVar16 = 1;
    do {
      local_51c = uVar16;
      pcVar24 = pcVar13;
      lVar15 = lVar14 / (long)(ulong)bVar6;
      *pcVar24 = *(char *)(lVar17 + lVar14 % (long)(ulong)bVar6);
      iVar7 = iVar7 + -1;
      lVar14 = lVar15;
      pcVar13 = pcVar24 + -1;
      uVar16 = local_51c + 1;
    } while (0 < lVar15);
    if (local_50c == 0) {
      uVar8 = uVar22;
    }
    if ((int)local_51c < (int)uVar8) {
      pcVar24 = pcVar24 + -1 + -(ulong)(iVar7 + uVar8);
      memset(pcVar24,0x30,(ulong)(uVar8 - (local_51c + 1)) + 1);
    }
    if ((char)local_500._0_10_ == '\0') {
      pcVar24[-1] = (char)local_508;
      pcVar24 = pcVar24 + -1;
    }
    if ((((int)local_518 != 0) &&
        (pcVar13 = *(char **)((long)&aFmt[0].prefix + lVar27), pcVar13 != (char *)0x0)) &&
       (cVar19 = *pcVar13, *pcVar24 != cVar19)) {
      while (cVar19 != '\0') {
        pcVar13 = pcVar13 + 1;
        pcVar24[-1] = cVar19;
        pcVar24 = pcVar24 + -1;
        cVar19 = *pcVar13;
      }
    }
    pcVar13 = local_3a + 1;
    local_51c = (int)pcVar13 - (int)pcVar24;
    goto LAB_001354a3;
  case (char *)0x4:
    goto switchD_00135572_caseD_4;
  case (char *)0x5:
    if ((int)local_524 < local_4e4) {
      pcVar13 = (char *)(long)(int)local_524;
      local_524 = local_524 + 1;
      if ((local_4c0[(long)pcVar13] == (jx9_value *)0x0) ||
         (pcVar13 = jx9_value_to_string(local_4c0[(long)pcVar13],(int *)&local_51c),
         pcVar24 = pcVar13, (int)local_51c < 1)) goto LAB_001358c6;
    }
    else {
LAB_001358c6:
      local_51c = 1;
      pcVar24 = " ";
    }
    if (uVar22 < local_51c) {
      local_51c = uVar22;
    }
    if (local_50c != 0) {
      local_498 = _DAT_00142380;
      local_478 = DAT_00142380._0_8_;
      uStack_470 = DAT_00142380._8_7_;
      uStack_469 = DAT_00142380._15_1_;
      uStack_468 = 0x3030;
      local_488 = local_498;
    }
    goto LAB_001354a3;
  case (char *)0x6:
    local_438[0] = '%';
    goto LAB_00135489;
  case (char *)0x7:
    if ((int)local_524 < local_4e4) {
      lVar27 = (long)(int)local_524;
      local_524 = local_524 + 1;
      pjVar1 = local_4c0[lVar27];
      if (pjVar1 == (jx9_value *)0x0) goto LAB_00135924;
      sVar10 = jx9MemObjToInteger(pjVar1);
      pcVar13 = (char *)(ulong)CONCAT31((int3)((uint)sVar10 >> 8),*(undefined1 *)&pjVar1->x);
    }
    else {
LAB_00135924:
      pcVar13 = (char *)0x0;
    }
    local_438[0] = (char)pcVar13;
    goto LAB_00135489;
  }
  local_500._8_2_ = SUB102(Var5,8);
  if ((int)local_524 < local_4e4) {
    lVar14 = (long)(int)local_524;
    local_524 = local_524 + 1;
    local_508 = local_4c0[lVar14];
    if (local_508 == (jx9_value *)0x0) goto LAB_001356a7;
    local_4c8 = (char *)CONCAT44(local_4c8._4_4_,iVar21);
    local_518 = uVar20;
    local_4f0 = iVar7;
    jx9MemObjToReal(local_508);
    local_440 = (local_508->x).rVal;
    lVar30 = (longdouble)local_440;
    uVar12 = 0x3d8;
    if ((int)uVar22 < 0x3d8) {
      uVar12 = (ulong)uVar22;
    }
    if ((int)uVar22 < 0) {
      uVar12 = 6;
    }
    bVar6 = (byte)local_500._0_10_;
    uVar20 = local_518;
    if (0.0 <= local_440) {
      iVar7 = local_4f0;
      iVar21 = (int)local_4c8;
      goto LAB_001356cd;
    }
    lVar30 = -lVar30;
    cVar19 = '-';
    local_508 = (jx9_value *)0x1;
    bVar29 = false;
  }
  else {
LAB_001356a7:
    uVar12 = 0x3d8;
    if ((int)uVar22 < 0x3d8) {
      uVar12 = (ulong)uVar22;
    }
    if ((int)uVar22 < 0) {
      uVar12 = 6;
    }
    lVar30 = (longdouble)0;
LAB_001356cd:
    if (iVar21 == 0) {
      bVar29 = iVar7 == 0;
      local_508 = (jx9_value *)(ulong)!bVar29;
      cVar19 = !bVar29 << 5;
    }
    else {
      cVar19 = '+';
      local_508 = (jx9_value *)0x1;
      bVar29 = false;
    }
  }
  iVar7 = (int)uVar12;
  uVar16 = (uint)(0 < iVar7 && bVar6 == 4);
  uVar22 = iVar7 - uVar16;
  pcVar13 = (char *)(ulong)uVar22;
  lVar31 = (longdouble)0.5;
  if (0 < (int)uVar22) {
    uVar12 = (ulong)((iVar7 - uVar16) + 1);
    local_448 = 0.5;
    do {
      local_448 = local_448 * 0.1;
      uVar16 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar16;
    } while (1 < uVar16);
    lVar31 = (longdouble)local_448;
  }
  if (bVar6 == 2) {
    lVar30 = lVar30 + lVar31;
  }
  uVar16 = 0;
  if ((longdouble)0 < lVar30) {
    uVar16 = 0;
    if ((longdouble)1e+08 <= lVar30) {
      uVar23 = 0;
      do {
        lVar30 = lVar30 * (longdouble)1e-08;
        uVar16 = uVar23 + 8;
        if (lVar30 < (longdouble)1e+08) break;
        bVar28 = uVar23 < 0x157;
        uVar23 = uVar16;
      } while (bVar28);
    }
    uVar23 = uVar16;
    if (uVar16 < 0x15f && (longdouble)10.0 <= lVar30) {
      do {
        lVar30 = lVar30 * (longdouble)0.1;
        uVar16 = uVar23 + 1;
        if (lVar30 < (longdouble)10.0) break;
        bVar28 = uVar23 < 0x15e;
        uVar23 = uVar16;
      } while (bVar28);
    }
    uVar23 = uVar16;
    if (lVar30 < (longdouble)1e-08) {
      do {
        lVar30 = lVar30 * (longdouble)1e+08;
        uVar16 = uVar23 - 8;
        if ((longdouble)1e-08 <= lVar30) break;
        bVar28 = -0x157 < (int)uVar23;
        uVar23 = uVar16;
      } while (bVar28);
    }
    if ((lVar30 < (longdouble)1) && (uVar23 = uVar16, -0x15f < (int)uVar16)) {
      do {
        lVar30 = lVar30 * (longdouble)10.0;
        uVar16 = uVar23 - 1;
        if ((longdouble)1 <= lVar30) break;
        bVar28 = -0x15e < (int)uVar23;
        uVar23 = uVar16;
      } while (bVar28);
    }
    uVar12 = (ulong)(uVar16 - 0x15f);
    bVar6 = (byte)local_500._0_10_;
    if (0xfffffd42 < uVar16 - 0x15f) goto LAB_00135a45;
    local_51c = 3;
    pcVar24 = "NaN";
  }
  else {
LAB_00135a45:
    iVar7 = (int)uVar20;
    if (bVar6 == 2) {
      bVar28 = true;
      local_518 = local_518 & 0xffffffff00000000;
LAB_00135aa7:
      if ((!bVar28) || (0x3e1 < (int)(uVar22 + uVar16))) goto LAB_00135b5c;
      pcVar13 = local_438;
      if (!bVar29) {
        local_438[0] = cVar19;
        pcVar13 = local_438 + 1;
      }
      if ((int)uVar16 < 0) {
        *pcVar13 = '0';
        pcVar13 = pcVar13 + 1;
        uVar16 = uVar16 + 1;
        uVar23 = 0;
      }
      else {
        uVar23 = uVar16 + 1;
        lVar27 = 0;
        do {
          cVar19 = '0';
          if ((uint)lVar27 < 0x10) {
            local_4da = in_FPUControlWord | 0xc00;
            local_4b0 = (int)ROUND(lVar30);
            lVar30 = (lVar30 - (longdouble)local_4b0) * (longdouble)10.0;
            cVar19 = (char)local_4b0 + '0';
            local_4ac = local_4b0;
          }
          pcVar13[lVar27] = cVar19;
          lVar27 = lVar27 + 1;
        } while (uVar16 + 1 != (int)lVar27);
        pcVar13 = pcVar13 + lVar27;
        uVar16 = 0;
      }
      bVar6 = 0 < (int)uVar22 || iVar7 != 0;
      if (0 < (int)uVar22 || iVar7 != 0) {
        pcVar24 = pcVar13 + 1;
        *pcVar13 = '.';
        if (((int)uVar16 < 0) && (0 < (int)uVar22)) {
          uVar11 = uVar22 - 1;
          uVar16 = ~uVar16;
          uVar2 = uVar16;
          if (uVar11 < uVar16) {
            uVar2 = uVar11;
          }
          local_4c8 = pcVar13 + (ulong)uVar2 + 2;
          uVar22 = uVar11 - uVar16;
          if (uVar11 < uVar16) {
            uVar22 = 0;
          }
          local_4f0 = CONCAT31(local_4f0._1_3_,bVar6);
          local_500._0_10_ = lVar30;
          memset(pcVar24,0x30,(ulong)uVar2 + 1);
          pcVar24 = local_4c8;
          lVar30 = (longdouble)local_500._0_10_;
          bVar6 = (byte)local_4f0;
        }
        if (0 < (int)uVar22) {
          uVar22 = uVar22 + 1;
          do {
            cVar19 = '0';
            if (uVar23 < 0x10) {
              local_4dc = in_FPUControlWord | 0xc00;
              local_4b8 = (int)ROUND(lVar30);
              lVar30 = (lVar30 - (longdouble)local_4b8) * (longdouble)10.0;
              cVar19 = (char)local_4b8 + '0';
              local_4b4 = local_4b8;
            }
            *pcVar24 = cVar19;
            pcVar24 = pcVar24 + 1;
            uVar22 = uVar22 - 1;
            uVar23 = uVar23 + 1;
          } while (1 < uVar22);
        }
        *pcVar24 = '\0';
        pcVar13 = pcVar24 + -1;
        if ((((byte)local_518 & bVar6) == 1) && (local_438 <= pcVar13)) {
          do {
            if (*pcVar13 != '0') {
              if (*pcVar13 == '.') goto LAB_00135dae;
              break;
            }
            *pcVar13 = '\0';
            pcVar13 = pcVar13 + -1;
          } while (local_438 <= pcVar13);
        }
      }
      else {
LAB_00135dae:
        *pcVar13 = '\0';
        pcVar13 = pcVar13 + -1;
      }
      iVar7 = (int)pcVar13 + 1;
    }
    else {
      lVar31 = lVar31 + lVar30;
      lVar30 = lVar31;
      if (lVar31 >= (longdouble)10.0) {
        lVar30 = lVar31 * (longdouble)0.1;
      }
      uVar16 = (uVar16 + 1) - (uint)(lVar31 < (longdouble)10.0);
      if (bVar6 == 4) {
        local_518 = CONCAT44(local_518._4_4_,(int)CONCAT71((int7)(uVar12 >> 8),iVar7 == 0));
        bVar28 = (int)uVar16 <= (int)uVar22 && -5 < (int)uVar16;
        uVar23 = 0;
        if ((int)uVar16 <= (int)uVar22 && -5 < (int)uVar16) {
          uVar23 = uVar16;
        }
        uVar22 = uVar22 - uVar23;
        goto LAB_00135aa7;
      }
      local_518 = (ulong)local_518._4_4_ << 0x20;
LAB_00135b5c:
      pcVar13 = local_438;
      if (!bVar29) {
        local_438[0] = cVar19;
        pcVar13 = local_438 + 1;
      }
      local_4de = in_FPUControlWord | 0xc00;
      local_4a0 = (int)ROUND(lVar30);
      lVar30 = (lVar30 - (longdouble)local_4a0) * (longdouble)10.0;
      *pcVar13 = (char)local_4a0 + '0';
      if (0 < (int)uVar22 || iVar7 != 0) {
        pcVar24 = pcVar13 + 2;
        pcVar13[1] = '.';
        if (0 < (int)uVar22) {
          uVar20 = 0;
          do {
            cVar19 = '0';
            if ((int)uVar20 + 1U < 0x10) {
              local_4e0 = in_FPUControlWord | 0xc00;
              local_4a8 = (int)ROUND(lVar30);
              lVar30 = (lVar30 - (longdouble)local_4a8) * (longdouble)10.0;
              cVar19 = (char)local_4a8 + '0';
              local_4a4 = local_4a8;
            }
            pcVar24[uVar20] = cVar19;
            uVar20 = uVar20 + 1;
          } while (uVar22 != uVar20);
          pcVar24 = pcVar24 + uVar20;
        }
        pcVar13 = pcVar24 + -1;
        if ((((byte)local_518 & (0 < (int)uVar22 || iVar7 != 0)) == 1) && (local_438 <= pcVar13)) {
          do {
            if (*pcVar13 != '0') {
              if (*pcVar13 == '.') {
                *pcVar13 = '\0';
                pcVar13 = pcVar13 + -1;
              }
              break;
            }
            *pcVar13 = '\0';
            pcVar13 = pcVar13 + -1;
          } while (local_438 <= pcVar13);
        }
      }
      local_49c = local_4a0;
      if (((byte)local_500._0_10_ == 3) || (uVar16 != 0)) {
        pcVar13[1] = **(char **)((long)&aFmt[0].charset + lVar27);
        uVar22 = -uVar16;
        if (0 < (int)uVar16) {
          uVar22 = uVar16;
        }
        pcVar13[2] = (char)((int)uVar16 >> 0x1f) * -2 + '+';
        if (uVar22 < 100) {
          pbVar26 = (byte *)(pcVar13 + 3);
        }
        else {
          pcVar13[3] = (char)(uVar22 / 100) + '0';
          pbVar26 = (byte *)(pcVar13 + 4);
          uVar22 = uVar22 % 100;
        }
        bVar6 = (byte)((uVar22 & 0xff) / 10);
        *pbVar26 = bVar6 | 0x30;
        pbVar26[1] = (char)uVar22 + bVar6 * -10 | 0x30;
        iVar7 = (int)pbVar26 + 2;
      }
      else {
        iVar7 = (int)pcVar13 + 1;
      }
    }
    pcVar13 = local_438;
    local_51c = iVar7 - (int)pcVar13;
    uVar22 = local_51c;
    if (((local_50c != 0) && (!bVar4)) && (uVar9 - local_51c != 0 && (int)local_51c <= (int)uVar9))
    {
      if (-1 < (int)local_51c) {
        if (0x3f5 < (int)uVar8) {
          uVar8 = 0x3f6;
        }
        pcVar13 = (char *)((long)(int)uVar8 + 1);
        lVar27 = (long)(int)local_51c;
        do {
          pcVar13[(long)&local_440 + 7] = local_438[lVar27];
          pcVar13 = pcVar13 + -1;
          lVar27 = lVar27 + -1;
        } while ((long)(int)(uVar9 - local_51c) < (long)pcVar13);
      }
      uVar22 = uVar9;
      if (uVar9 != local_51c) {
        pcVar13 = (char *)memset(local_438 + (long)local_508,0x30,
                                 (ulong)(((int)local_458 + uVar9) - iVar7) + 1);
      }
    }
    local_51c = uVar22;
    pcVar24 = local_438;
  }
LAB_001354a3:
  if ((!bVar4) && (uVar8 = uVar9 - local_51c, uVar8 != 0 && (int)local_51c <= (int)uVar9)) {
    if (0x31 < uVar8) {
      do {
        uVar22 = (*local_4d8)(local_4d0,local_498,0x32,pUserData);
        pcVar13 = (char *)(ulong)uVar22;
        if (uVar22 != 0) {
          return uVar22;
        }
        uVar8 = uVar8 - 0x32;
      } while (0x31 < uVar8);
      if (uVar8 == 0) goto LAB_001354b3;
    }
    uVar8 = (*local_4d8)(local_4d0,local_498,uVar8,pUserData);
    pcVar13 = (char *)(ulong)uVar8;
    if (uVar8 != 0) {
      return uVar8;
    }
  }
LAB_001354b3:
  if (0 < (int)local_51c) {
    uVar8 = (*local_4d8)(local_4d0,pcVar24,local_51c,pUserData);
    pcVar13 = (char *)(ulong)uVar8;
    if (uVar8 != 0) {
      return uVar8;
    }
  }
  if ((!bVar4) || (uVar8 = uVar9 - local_51c, uVar8 == 0 || (int)uVar9 < (int)local_51c))
  goto LAB_0013522b;
  if (0x31 < uVar8) {
    do {
      uVar9 = (*local_4d8)(local_4d0,local_498,0x32,pUserData);
      pcVar13 = (char *)(ulong)uVar9;
      if (uVar9 != 0) {
        return uVar9;
      }
      uVar8 = uVar8 - 0x32;
    } while (0x31 < uVar8);
    if (uVar8 == 0) goto LAB_0013522b;
  }
  uVar8 = (*local_4d8)(local_4d0,local_498,uVar8,pUserData);
  pcVar13 = (char *)(ulong)uVar8;
  if (uVar8 != 0) {
    return uVar8;
  }
  goto LAB_0013522b;
code_r0x00135474:
  lVar27 = lVar27 + 0x20;
  pcVar13 = (char *)CONCAT71((int7)(uVar12 >> 8),*pbVar18);
  if (lVar27 == 0x1e0) goto switchD_00135572_caseD_4;
  goto LAB_0013546a;
switchD_00135572_caseD_4:
  local_438[0] = '?';
LAB_00135489:
  local_51c = 1;
  pcVar24 = local_438;
  goto LAB_001354a3;
}

Assistant:

JX9_PRIVATE sxi32 jx9InputFormat(
	int (*xConsumer)(jx9_context *, const char *, int, void *), /* Format consumer */
	jx9_context *pCtx,  /* call context */
	const char *zIn,    /* Format string */
	int nByte,          /* Format string length */
	int nArg,           /* Total argument of the given arguments */
	jx9_value **apArg,  /* User arguments */
	void *pUserData,    /* Last argument to xConsumer() */
	int vf              /* TRUE if called from vfprintf, vsprintf context */ 
	)
{
	char spaces[] = "                                                  ";
#define etSPACESIZE ((int)sizeof(spaces)-1)
	const char *zCur, *zEnd = &zIn[nByte];
	char *zBuf, zWorker[JX9_FMT_BUFSIZ];       /* Working buffer */
	const jx9_fmt_info *pInfo;  /* Pointer to the appropriate info structure */
	int flag_alternateform; /* True if "#" flag is present */
	int flag_leftjustify;   /* True if "-" flag is present */
	int flag_blanksign;     /* True if " " flag is present */
	int flag_plussign;      /* True if "+" flag is present */
	int flag_zeropad;       /* True if field width constant starts with zero */
	jx9_value *pArg;         /* Current processed argument */
	jx9_int64 iVal;
	int precision;           /* Precision of the current field */
	char *zExtra;  
	int c, rc, n;
	int length;              /* Length of the field */
	int prefix;
	sxu8 xtype;              /* Conversion paradigm */
	int width;               /* Width of the current field */
	int idx;
	n = (vf == TRUE) ? 0 : 1;
#define NEXT_ARG	( n < nArg ? apArg[n++] : 0 )
	/* Start the format process */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '%' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Consume chunk verbatim */
			rc = xConsumer(pCtx, zCur, (int)(zIn-zCur), pUserData);
			if( rc == SXERR_ABORT ){
				/* Callback request an operation abort */
				break;
			}
		}
		if( zIn >= zEnd ){
			/* No more input to process, break immediately */
			break;
		}
		/* Find out what flags are present */
		flag_leftjustify = flag_plussign = flag_blanksign = 
			flag_alternateform = flag_zeropad = 0;
		zIn++; /* Jump the precent sign */
		do{
			c = zIn[0];
			switch( c ){
			case '-':   flag_leftjustify = 1;     c = 0;   break;
			case '+':   flag_plussign = 1;        c = 0;   break;
			case ' ':   flag_blanksign = 1;       c = 0;   break;
			case '#':   flag_alternateform = 1;   c = 0;   break;
			case '0':   flag_zeropad = 1;         c = 0;   break;
			case '\'':
				zIn++;
				if( zIn < zEnd ){
					/* An alternate padding character can be specified by prefixing it with a single quote (') */
					c = zIn[0];
					for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
						spaces[idx] = (char)c;
					}
					c = 0;
				}
				break;
			default:                                       break;
			}
		}while( c==0 && (zIn++ < zEnd) );
		/* Get the field width */
		width = 0;
		while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
			width = width*10 + (zIn[0] - '0');
			zIn++;
		}
		if( zIn < zEnd && zIn[0] == '$' ){
			/* Position specifer */
			if( width > 0 ){
				n = width;
				if( vf && n > 0 ){ 
					n--;
				}
			}
			zIn++;
			width = 0;
			if( zIn < zEnd && zIn[0] == '0' ){
				flag_zeropad = 1;
				zIn++;
			}
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				width = width*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( width > JX9_FMT_BUFSIZ-10 ){
			width = JX9_FMT_BUFSIZ-10;
		}
		/* Get the precision */
		precision = -1;
		if( zIn < zEnd && zIn[0] == '.' ){
			precision = 0;
			zIn++;
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				precision = precision*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( zIn >= zEnd ){
			/* No more input */
			break;
		}
		/* Fetch the info entry for the field */
		pInfo = 0;
		xtype = JX9_FMT_ERROR;
		c = zIn[0];
		zIn++; /* Jump the format specifer */
		for(idx=0; idx< (int)SX_ARRAYSIZE(aFmt); idx++){
			if( c==aFmt[idx].fmttype ){
				pInfo = &aFmt[idx];
				xtype = pInfo->type;
				break;
			}
		}
		zBuf = zWorker; /* Point to the working buffer */
		length = 0;
		zExtra = 0;
		 /*
		  ** At this point, variables are initialized as follows:
		  **
		  **   flag_alternateform          TRUE if a '#' is present.
		  **   flag_plussign               TRUE if a '+' is present.
		  **   flag_leftjustify            TRUE if a '-' is present or if the
		  **                               field width was negative.
		  **   flag_zeropad                TRUE if the width began with 0.
		  **                               the conversion character.
		  **   flag_blanksign              TRUE if a ' ' is present.
		  **   width                       The specified field width.  This is
		  **                               always non-negative.  Zero is the default.
		  **   precision                   The specified precision.  The default
		  **                               is -1.
		  */
		switch(xtype){
		case JX9_FMT_PERCENT:
			/* A literal percent character */
			zWorker[0] = '%';
			length = (int)sizeof(char);
			break;
		case JX9_FMT_CHARX:
			/* The argument is treated as an integer, and presented as the character
			 * with that ASCII value
			 */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				c = 0;
			}else{
				c = jx9_value_to_int(pArg);
			}
			/* NUL byte is an acceptable value */
			zWorker[0] = (char)c;
			length = (int)sizeof(char);
			break;
		case JX9_FMT_STRING:
			/* the argument is treated as and presented as a string */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				length = 0;
			}else{
				zBuf = (char *)jx9_value_to_string(pArg, &length);
			}
			if( length < 1 ){
				zBuf = " ";
				length = (int)sizeof(char);
			}
			if( precision>=0 && precision<length ){
				length = precision;
			}
			if( flag_zeropad ){
				/* zero-padding works on strings too */
				for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
					spaces[idx] = '0';
				}
			}
			break;
		case JX9_FMT_RADIX:
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				iVal = 0;
			}else{
				iVal = jx9_value_to_int64(pArg);
			}
			/* Limit the precision to prevent overflowing buf[] during conversion */
			if( precision>JX9_FMT_BUFSIZ-40 ){
				precision = JX9_FMT_BUFSIZ-40;
			}
#if 1
        /* For the format %#x, the value zero is printed "0" not "0x0".
        ** I think this is stupid.*/
        if( iVal==0 ) flag_alternateform = 0;
#else
        /* More sensible: turn off the prefix for octal (to prevent "00"), 
        ** but leave the prefix for hex.*/
        if( iVal==0 && pInfo->base==8 ) flag_alternateform = 0;
#endif
        if( pInfo->flags & JX9_FMT_FLAG_SIGNED ){
          if( iVal<0 ){ 
            iVal = -iVal;
			/* Ticket 1433-003 */
			if( iVal < 0 ){
				/* Overflow */
				iVal= 0x7FFFFFFFFFFFFFFF;
			}
            prefix = '-';
          }else if( flag_plussign )  prefix = '+';
          else if( flag_blanksign )  prefix = ' ';
          else                       prefix = 0;
        }else{
			if( iVal<0 ){
				iVal = -iVal;
				/* Ticket 1433-003 */
				if( iVal < 0 ){
					/* Overflow */
					iVal= 0x7FFFFFFFFFFFFFFF;
				}
			}
			prefix = 0;
		}
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        zBuf = &zWorker[JX9_FMT_BUFSIZ-1];
        {
          register char *cset;      /* Use registers for speed */
          register int base;
          cset = pInfo->charset;
          base = pInfo->base;
          do{                                           /* Convert to ascii */
            *(--zBuf) = cset[iVal%base];
            iVal = iVal/base;
          }while( iVal>0 );
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
        for(idx=precision-length; idx>0; idx--){
          *(--zBuf) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--zBuf) = (char)prefix;               /* Add sign */
        if( flag_alternateform && pInfo->prefix ){      /* Add "0" or "0x" */
          char *pre, x;
          pre = pInfo->prefix;
          if( *zBuf!=pre[0] ){
            for(pre=pInfo->prefix; (x=(*pre))!=0; pre++) *(--zBuf) = x;
          }
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
		break;
		case JX9_FMT_FLOAT:
		case JX9_FMT_EXP:
		case JX9_FMT_GENERIC:{
#ifndef JX9_OMIT_FLOATING_POINT
		long double realvalue;
		int  exp;                /* exponent of real numbers */
		double rounder;          /* Used for rounding floating point values */
		int flag_dp;            /* True if decimal point should be shown */
		int flag_rtz;           /* True if trailing zeros should be removed */
		int flag_exp;           /* True to force display of the exponent */
		int nsd;                 /* Number of significant digits returned */
		pArg = NEXT_ARG;
		if( pArg == 0 ){
			realvalue = 0;
		}else{
			realvalue = jx9_value_to_double(pArg);
		}
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( precision>JX9_FMT_BUFSIZ-40) precision = JX9_FMT_BUFSIZ-40;
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( pInfo->type==JX9_FMT_GENERIC && precision>0 ) precision--;
        rounder = 0.0;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1);
#endif
        if( pInfo->type==JX9_FMT_FLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( realvalue>0.0 ){
          while( realvalue>=1e8 && exp<=350 ){ realvalue *= 1e-8; exp+=8; }
          while( realvalue>=10.0 && exp<=350 ){ realvalue *= 0.1; exp++; }
          while( realvalue<1e-8 && exp>=-350 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 && exp>=-350 ){ realvalue *= 10.0; exp--; }
          if( exp>350 || exp<-350 ){
            zBuf = "NaN";
            length = 3;
            break;
          }
        }
        zBuf = zWorker;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        flag_exp = xtype==JX9_FMT_EXP;
        if( xtype!=JX9_FMT_FLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==JX9_FMT_GENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = JX9_FMT_EXP;
          }else{
            precision = precision - exp;
            xtype = JX9_FMT_FLOAT;
          }
        }else{
          flag_rtz = 0;
        }
        /*
        ** The "exp+precision" test causes output to be of type etEXP if
        ** the precision is too large to fit in buf[].
        */
        nsd = 0;
        if( xtype==JX9_FMT_FLOAT && exp+precision<JX9_FMT_BUFSIZ-30 ){
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;         /* Sign */
          if( exp<0 )  *(zBuf++) = '0';            /* Digits before "." */
          else for(; exp>=0; exp--) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          if( flag_dp ) *(zBuf++) = '.';           /* The decimal point */
          for(exp++; exp<0 && precision>0; precision--, exp++){
            *(zBuf++) = '0';
          }
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          *(zBuf--) = 0;                           /* Null terminate */
          if( flag_rtz && flag_dp ){     /* Remove trailing zeros and "." */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
        }else{    /* etEXP or etGENERIC */
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;   /* Sign */
          *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);  /* First digit */
          if( flag_dp ) *(zBuf++) = '.';     /* Decimal point */
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          zBuf--;                            /* point to last digit */
          if( flag_rtz && flag_dp ){          /* Remove tail zeros */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
          if( exp || flag_exp ){
            *(zBuf++) = pInfo->charset[0];
            if( exp<0 ){ *(zBuf++) = '-'; exp = -exp; } /* sign of exp */
            else       { *(zBuf++) = '+'; }
            if( exp>=100 ){
              *(zBuf++) = (char)((exp/100)+'0');                /* 100's digit */
              exp %= 100;
            }
            *(zBuf++) = (char)(exp/10+'0');                     /* 10's digit */
            *(zBuf++) = (char)(exp%10+'0');                     /* 1's digit */
          }
        }
        /* The converted number is in buf[] and zero terminated.Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions.*/
        length = (int)(zBuf-zWorker);
        zBuf = zWorker;
        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            zBuf[i] = zBuf[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) zBuf[i++] = '0';
          length = width;
        }
#else
         zBuf = " ";
		 length = (int)sizeof(char);
#endif /* JX9_OMIT_FLOATING_POINT */
		 break;
							 }
		default:
			/* Invalid format specifer */
			zWorker[0] = '?';
			length = (int)sizeof(char);
			break;
		}
		 /*
		 ** The text of the conversion is pointed to by "zBuf" and is
		 ** "length" characters long.The field width is "width".Do
		 ** the output.
		 */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
    if( length>0 ){
		rc = xConsumer(pCtx, zBuf, (unsigned int)length, pUserData);
		if( rc != SXRET_OK ){
		  return SXERR_ABORT; /* Consumer routine request an operation abort */
		}
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
 }/* for(;;) */
	return SXRET_OK;
}